

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
* __thiscall
despot::Parser::ComputeTopTransitions
          (vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
           *__return_storage_ptr__,Parser *this,vector<int,_std::allocator<int>_> *state,
          ACT_TYPE action,int num)

{
  pointer piVar1;
  pointer pSVar2;
  CPT *pCVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  iterator iVar6;
  long lVar7;
  pointer ppVar8;
  long lVar9;
  iterator iVar10;
  double *pdVar11;
  pair<int,_double> *ppVar12;
  int *piVar13;
  long lVar14;
  ulong __new_size;
  ulong uVar15;
  pair<int,_double> *ppVar16;
  uint uVar17;
  ulong uVar18;
  pointer ppVar19;
  pointer extraout_XMM0_Qa;
  double dVar20;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  *best;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> distribution;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  tmp;
  pair<std::vector<int,_std::allocator<int>_>,_double> next;
  vector<int,_std::allocator<int>_> state_1;
  pair<int,_double> *local_d8;
  iterator iStack_d0;
  pair<int,_double> *local_c8;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  local_b8;
  pair<std::vector<int,_std::allocator<int>_>,_double> local_98;
  ulong local_70;
  vector<int,_std::allocator<int>_> *local_68;
  ulong local_60;
  double local_58;
  void *local_50;
  iterator local_48;
  int *local_40;
  Parser *local_38;
  
  piVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar9 = (long)(state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 2;
    piVar13 = &(((this->prev_state_vars_).
                 super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_NamedVar).super_Variable.curr_value;
    lVar14 = 0;
    do {
      *piVar13 = piVar1[lVar14];
      lVar14 = lVar14 + 1;
      piVar13 = piVar13 + 0x30;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar14);
  }
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.second = 1.0;
  local_68 = state;
  std::
  vector<std::pair<std::vector<int,std::allocator<int>>,double>,std::allocator<std::pair<std::vector<int,std::allocator<int>>,double>>>
  ::emplace_back<std::pair<std::vector<int,std::allocator<int>>,double>>
            ((vector<std::pair<std::vector<int,std::allocator<int>>,double>,std::allocator<std::pair<std::vector<int,std::allocator<int>>,double>>>
              *)__return_storage_ptr__,&local_98);
  if (local_98.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    __new_size = (ulong)num;
    uVar15 = 0;
    local_38 = this;
    do {
      local_d8 = (pair<int,_double> *)0x0;
      iStack_d0._M_current = (pair<int,_double> *)0x0;
      local_c8 = (pair<int,_double> *)0x0;
      iVar4 = (*((this->transition_funcs_).
                 super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15]->super_Function)._vptr_Function[6])();
      uVar5 = Variable::ComputeCurrentIndex
                        ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
                         CONCAT44(extraout_var,iVar4));
      pSVar2 = (this->prev_state_vars_).
               super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_60 = uVar15;
      if (0 < (int)((ulong)((long)pSVar2[uVar15].super_NamedVar.super_Variable.values_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           *(long *)&pSVar2[uVar15].super_NamedVar.super_Variable.values_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data) >> 5)) {
        uVar18 = 0;
        do {
          pCVar3 = (this->transition_funcs_).
                   super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
                   super__Vector_impl_data._M_start[local_60];
          (*(pCVar3->super_Function)._vptr_Function[4])(pCVar3,(ulong)uVar5,uVar18);
          if (0.0 < (double)extraout_XMM0_Qa) {
            local_98.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_98.first.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,(int)uVar18);
            local_98.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = extraout_XMM0_Qa;
            if (iStack_d0._M_current == local_c8) {
              std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
              _M_realloc_insert<std::pair<int,double>>
                        ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                         &local_d8,iStack_d0,(pair<int,_double> *)&local_98);
            }
            else {
              *(pointer *)iStack_d0._M_current =
                   local_98.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              (iStack_d0._M_current)->second = (double)extraout_XMM0_Qa;
              iStack_d0._M_current = iStack_d0._M_current + 1;
            }
          }
          uVar17 = (int)uVar18 + 1;
          uVar18 = (ulong)uVar17;
          pSVar2 = (this->prev_state_vars_).
                   super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while ((int)uVar17 <
                 (int)((ulong)((long)pSVar2[uVar15].super_NamedVar.super_Variable.values_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              *(long *)&pSVar2[uVar15].super_NamedVar.super_Variable.values_.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data) >> 5));
      }
      local_b8.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppVar19 = (__return_storage_ptr__->
                super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar8 = (__return_storage_ptr__->
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar8 != ppVar19) {
        local_70 = 0;
        iVar6._M_current = iStack_d0._M_current;
        iVar10._M_current = iStack_d0._M_current;
        ppVar12 = local_d8;
        do {
          ppVar16 = ppVar12;
          if (iVar10._M_current != ppVar12) {
            ppVar19 = ppVar19 + local_70;
            uVar15 = 0;
            do {
              dVar20 = ppVar19->second * ppVar16[uVar15].second;
              if (((long)local_b8.
                         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_b8.
                         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5 != __new_size) ||
                 (local_b8.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].second <= dVar20)) {
                local_58 = dVar20;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&local_50,&ppVar19->first);
                if (local_48._M_current == local_40) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_50,local_48,
                             &ppVar16[uVar15].first);
                }
                else {
                  *local_48._M_current = ppVar16[uVar15].first;
                  local_48._M_current = local_48._M_current + 1;
                }
                std::vector<int,_std::allocator<int>_>::vector
                          (&local_98.first,(vector<int,_std::allocator<int>_> *)&local_50);
                local_98.second = local_58;
                if ((long)local_b8.
                          super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_b8.
                          super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == 0) {
                  lVar9 = 0;
                }
                else {
                  lVar14 = (long)local_b8.
                                 super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_b8.
                                 super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5;
                  lVar14 = lVar14 + (ulong)(lVar14 == 0);
                  pdVar11 = &(local_b8.
                              super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->second;
                  lVar7 = 0;
                  do {
                    lVar9 = lVar7;
                    if (*pdVar11 <= local_58 && local_58 != *pdVar11) break;
                    lVar7 = lVar7 + 1;
                    pdVar11 = pdVar11 + 4;
                    lVar9 = lVar14;
                  } while (lVar14 != lVar7);
                }
                std::
                vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                ::insert(&local_b8,
                         local_b8.
                         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9,&local_98);
                if ((num != -1) &&
                   (__new_size <
                    (ulong)((long)local_b8.
                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_b8.
                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5))) {
                  std::
                  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ::resize(&local_b8,__new_size);
                }
                if (local_98.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_98.first.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_98.first.super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_98.first.super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                iVar6._M_current = iStack_d0._M_current;
                ppVar16 = local_d8;
                if (local_50 != (void *)0x0) {
                  operator_delete(local_50,(long)local_40 - (long)local_50);
                  iVar6._M_current = iStack_d0._M_current;
                  ppVar16 = local_d8;
                }
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 < (ulong)((long)iVar6._M_current - (long)ppVar16 >> 4));
            ppVar19 = (__return_storage_ptr__->
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            ppVar8 = (__return_storage_ptr__->
                     super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            ppVar12 = iVar6._M_current;
            this = local_38;
          }
          local_70 = local_70 + 1;
          iVar10._M_current = ppVar12;
          ppVar12 = ppVar16;
        } while (local_70 < (ulong)((long)ppVar8 - (long)ppVar19 >> 5));
      }
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
      ::operator=(__return_storage_ptr__,&local_b8);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
      ::~vector(&local_b8);
      uVar15 = local_60;
      if (local_d8 != (pair<int,_double> *)0x0) {
        operator_delete(local_d8,(long)local_c8 - (long)local_d8);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)(local_68->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_68->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<pair<vector<int>, double> > Parser::ComputeTopTransitions(
	const vector<int>& state, ACT_TYPE action, int num) const {
	for (int s = 0; s < state.size(); s++) {
		prev_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	vector<pair<vector<int>, double> > best;
	best.push_back(pair<vector<int>, double>(vector<int>(), 1.0));
	for (int s = 0; s < state.size(); s++) {
		// Compute sparse next state distribution
		vector<pair<int, double> > distribution;
		int pid = Variable::ComputeCurrentIndex(
			transition_funcs_[s]->parents());
		for (int v = 0; v < prev_state_vars_[s].Size(); v++) {
			double prob = transition_funcs_[s]->GetValue(pid, v);
			if (prob > 0)
				distribution.push_back(pair<int, double>(v, prob));
		}

		// Extend current best state vectors and keep the best
		vector<pair<vector<int>, double> > tmp;
		for (int i = 0; i < best.size(); i++) {
			const pair<vector<int>, double>& it1 = best[i];
			for (int j = 0; j < distribution.size(); j++) {
				const pair<int, double>& it2 = distribution[j];

				// Extend
				double prob = it1.second * it2.second;

				if (tmp.size() == num && prob < tmp.back().second)
					continue;

				vector<int> state = it1.first;
				state.push_back(it2.first);
				pair<vector<int>, double> next(state, prob);

				// Insert in descending order
				int k = 0;
				for (; k < tmp.size(); k++) {
					if (tmp[k].second < next.second)
						break;
				}
				tmp.insert(tmp.begin() + k, next);

				// Keep the best
				if (num != -1 && tmp.size() > num)
					tmp.resize(num);
			}
		}

		best = tmp;
	}
	return best;
}